

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_ringbuffer.h
# Opt level: O0

int __thiscall
ring_buffer_base<cubeb_log_message>::enqueue
          (ring_buffer_base<cubeb_log_message> *this,cubeb_log_message *elements,int count)

{
  bool bVar1;
  int *piVar2;
  long in_RSI;
  ring_buffer_base<cubeb_log_message> *in_RDI;
  int second_part;
  int first_part;
  int to_write;
  int rd_idx;
  int wr_idx;
  memory_order __b_1;
  memory_order __b;
  memory_order __b_2;
  size_t in_stack_ffffffffffffff48;
  atomic<int> *paVar3;
  ring_buffer_base<cubeb_log_message> *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  ring_buffer_base<cubeb_log_message> *this_00;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  __int_type_conflict local_64;
  __int_type_conflict local_60;
  int local_5c;
  long local_58;
  int local_48;
  __int_type_conflict local_44;
  memory_order local_40;
  int local_3c;
  __int_type_conflict local_2c;
  memory_order local_28;
  int local_24;
  atomic<int> *local_20;
  int local_10;
  int local_c;
  atomic<int> *local_8;
  
  paVar3 = &in_RDI->write_index_;
  local_24 = 0;
  local_58 = in_RSI;
  local_20 = paVar3;
  local_28 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_24 - 1U < 2) {
    local_2c = (paVar3->super___atomic_base<int>)._M_i;
  }
  else if (local_24 == 5) {
    local_2c = (paVar3->super___atomic_base<int>)._M_i;
  }
  else {
    local_2c = (paVar3->super___atomic_base<int>)._M_i;
  }
  local_60 = local_2c;
  local_3c = 2;
  this_00 = in_RDI;
  local_40 = std::operator&(memory_order_acquire,__memory_order_mask);
  if (local_3c - 1U < 2) {
    local_44 = (this_00->read_index_).super___atomic_base<int>._M_i;
  }
  else if (local_3c == 5) {
    local_44 = (this_00->read_index_).super___atomic_base<int>._M_i;
  }
  else {
    local_44 = (this_00->read_index_).super___atomic_base<int>._M_i;
  }
  local_64 = local_44;
  bVar1 = full_internal(in_stack_ffffffffffffff50,(int)(in_stack_ffffffffffffff48 >> 0x20),
                        (int)in_stack_ffffffffffffff48);
  if (bVar1) {
    local_48 = 0;
  }
  else {
    local_6c = available_write_internal(this_00,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
    ;
    piVar2 = std::min<int>(&local_6c,&local_5c);
    local_68 = *piVar2;
    local_74 = storage_capacity(in_RDI);
    local_74 = local_74 - local_60;
    piVar2 = std::min<int>(&local_74,&local_68);
    local_70 = *piVar2;
    if (local_58 == 0) {
      std::unique_ptr<cubeb_log_message[],_std::default_delete<cubeb_log_message[]>_>::get
                ((unique_ptr<cubeb_log_message[],_std::default_delete<cubeb_log_message[]>_> *)
                 0x11c353);
      ConstructDefault<cubeb_log_message>
                ((cubeb_log_message *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      std::unique_ptr<cubeb_log_message[],_std::default_delete<cubeb_log_message[]>_>::get
                ((unique_ptr<cubeb_log_message[],_std::default_delete<cubeb_log_message[]>_> *)
                 0x11c37a);
      ConstructDefault<cubeb_log_message>
                ((cubeb_log_message *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    }
    else {
      std::unique_ptr<cubeb_log_message[],_std::default_delete<cubeb_log_message[]>_>::get
                ((unique_ptr<cubeb_log_message[],_std::default_delete<cubeb_log_message[]>_> *)
                 0x11c2f9);
      Copy<cubeb_log_message>
                ((cubeb_log_message *)this_00,
                 (cubeb_log_message *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 (size_t)in_stack_ffffffffffffff50);
      std::unique_ptr<cubeb_log_message[],_std::default_delete<cubeb_log_message[]>_>::get
                ((unique_ptr<cubeb_log_message[],_std::default_delete<cubeb_log_message[]>_> *)
                 0x11c325);
      Copy<cubeb_log_message>
                ((cubeb_log_message *)this_00,
                 (cubeb_log_message *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 (size_t)in_stack_ffffffffffffff50);
    }
    paVar3 = &in_RDI->write_index_;
    local_c = increment_index(in_stack_ffffffffffffff50,(int)((ulong)paVar3 >> 0x20),(int)paVar3);
    local_10 = 3;
    local_8 = paVar3;
    std::operator&(memory_order_release,__memory_order_mask);
    if (local_10 == 3) {
      (paVar3->super___atomic_base<int>)._M_i = local_c;
    }
    else if (local_10 == 5) {
      LOCK();
      (paVar3->super___atomic_base<int>)._M_i = local_c;
      UNLOCK();
    }
    else {
      (paVar3->super___atomic_base<int>)._M_i = local_c;
    }
    local_48 = local_68;
  }
  return local_48;
}

Assistant:

int enqueue(T * elements, int count)
  {
#ifndef NDEBUG
    assert_correct_thread(producer_id);
#endif

    int wr_idx = write_index_.load(std::memory_order_relaxed);
    int rd_idx = read_index_.load(std::memory_order_acquire);

    if (full_internal(rd_idx, wr_idx)) {
      return 0;
    }

    int to_write = std::min(available_write_internal(rd_idx, wr_idx), count);

    /* First part, from the write index to the end of the array. */
    int first_part = std::min(storage_capacity() - wr_idx, to_write);
    /* Second part, from the beginning of the array */
    int second_part = to_write - first_part;

    if (elements) {
      Copy(data_.get() + wr_idx, elements, first_part);
      Copy(data_.get(), elements + first_part, second_part);
    } else {
      ConstructDefault(data_.get() + wr_idx, first_part);
      ConstructDefault(data_.get(), second_part);
    }

    write_index_.store(increment_index(wr_idx, to_write),
                       std::memory_order_release);

    return to_write;
  }